

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O3

int nghttp2_http_parse_priority(nghttp2_extpri *dest,uint8_t *value,size_t valuelen)

{
  size_t sVar1;
  long lVar2;
  undefined4 uVar3;
  byte bVar4;
  byte *end;
  uint uVar5;
  byte *pbVar6;
  byte *pbVar7;
  long lVar8;
  nghttp2_sf_value val;
  ulong local_50;
  nghttp2_sf_value local_48;
  byte *pbVar9;
  
  uVar5 = dest->urgency;
  local_50 = (ulong)uVar5;
  uVar3 = dest->inc;
  sVar1 = valuelen;
  pbVar6 = value;
  if (valuelen == 0) {
LAB_0062b4bb:
    end = value + valuelen;
    if (pbVar6 != end) {
      bVar4 = *pbVar6;
      do {
        pbVar7 = pbVar6;
        if (bVar4 != 0x2a && 0x19 < (byte)(bVar4 + 0x9f)) {
          return -0x1f5;
        }
        do {
          pbVar9 = pbVar7;
          if (SF_KEY_CHARS[*pbVar7] == 0) break;
          pbVar7 = pbVar7 + 1;
          pbVar9 = end;
        } while (pbVar7 != end);
        lVar8 = (long)pbVar9 - (long)pbVar6;
        if (lVar8 < 0) {
          return -0x1f5;
        }
        pbVar7 = pbVar6 + lVar8;
        if ((pbVar7 == end) || (*pbVar7 != 0x3d)) {
          local_48.type = '\0';
          local_48.field_1.b = 1;
          lVar2 = sf_parse_params(pbVar7,end);
        }
        else {
          pbVar7 = pbVar7 + 1;
          if (pbVar7 == end) {
            return -0x1f5;
          }
          if (*pbVar7 == 0x28) {
            lVar2 = sf_parse_inner_list(&local_48,pbVar7,end);
          }
          else {
            lVar2 = sf_parse_item(&local_48,pbVar7,end);
          }
        }
        if (lVar2 < 0) {
          return -0x1f5;
        }
        if (lVar8 == 1) {
          if (*pbVar6 == 0x75) {
            if (local_48.type != '\x01') {
              return -0x1f5;
            }
            local_50 = CONCAT44(local_48.field_1.i._4_4_,local_48.field_1.b);
            if (7 < local_50) {
              return -0x1f5;
            }
          }
          else if ((*pbVar6 == 0x69) && (uVar3 = local_48.field_1.b, local_48.type != '\0')) {
            return -0x1f5;
          }
        }
        pbVar6 = pbVar7 + lVar2;
        while( true ) {
          uVar5 = (uint)local_50;
          if (pbVar6 == end) goto LAB_0062b62e;
          bVar4 = *pbVar6;
          if ((bVar4 != 9) && (bVar4 != 0x20)) break;
          pbVar6 = pbVar6 + 1;
        }
        if (bVar4 != 0x2c) {
          return -0x1f5;
        }
        do {
          pbVar6 = pbVar6 + 1;
          if (pbVar6 == end) {
            return -0x1f5;
          }
          bVar4 = *pbVar6;
        } while ((bVar4 == 0x20) || (bVar4 == 9));
      } while (pbVar6 != end);
    }
  }
  else {
    do {
      if (*pbVar6 != 0x20) goto LAB_0062b4bb;
      sVar1 = sVar1 - 1;
      pbVar6 = pbVar6 + 1;
    } while (sVar1 != 0);
  }
LAB_0062b62e:
  dest->urgency = uVar5;
  dest->inc = uVar3;
  return 0;
}

Assistant:

int nghttp2_http_parse_priority(nghttp2_extpri *dest, const uint8_t *value,
                                size_t valuelen) {
  const uint8_t *p = value, *end = value + valuelen;
  ssize_t slen;
  nghttp2_sf_value val;
  nghttp2_extpri pri = *dest;
  const uint8_t *key;
  size_t keylen;

  for (; p != end && *p == ' '; ++p)
    ;

  for (; p != end;) {
    slen = sf_parse_key(p, end);
    if (slen < 0) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    key = p;
    keylen = (size_t)slen;

    p += slen;

    if (p == end || *p != '=') {
      /* Boolean true */
      val.type = NGHTTP2_SF_VALUE_TYPE_BOOLEAN;
      val.b = 1;

      slen = sf_parse_params(p, end);
      if (slen < 0) {
        return NGHTTP2_ERR_INVALID_ARGUMENT;
      }
    } else if (++p == end) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    } else {
      slen = sf_parse_item_or_inner_list(&val, p, end);
      if (slen < 0) {
        return NGHTTP2_ERR_INVALID_ARGUMENT;
      }
    }

    p += slen;

    if (keylen == 1) {
      switch (key[0]) {
      case 'i':
        if (val.type != NGHTTP2_SF_VALUE_TYPE_BOOLEAN) {
          return NGHTTP2_ERR_INVALID_ARGUMENT;
        }

        pri.inc = val.b;

        break;
      case 'u':
        if (val.type != NGHTTP2_SF_VALUE_TYPE_INTEGER ||
            val.i < NGHTTP2_EXTPRI_URGENCY_HIGH ||
            NGHTTP2_EXTPRI_URGENCY_LOW < val.i) {
          return NGHTTP2_ERR_INVALID_ARGUMENT;
        }

        pri.urgency = (uint32_t)val.i;

        break;
      }
    }

    sf_discard_ows(p, end);

    if (*p++ != ',') {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    sf_discard_ows_end_err(p, end, NGHTTP2_ERR_INVALID_ARGUMENT);
  }

fin:
  *dest = pri;

  return 0;
}